

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolData.cpp
# Opt level: O2

void __thiscall SymbolData::addLabel(SymbolData *this,int64_t memoryAddress,string *name)

{
  pointer pSVar1;
  pointer pSVar2;
  __type _Var3;
  SymDataSymbol *symbol;
  pointer __lhs;
  SymDataSymbol sym;
  value_type local_48;
  
  if (this->enabled == true) {
    local_48.name._M_dataplus._M_p = (pointer)&local_48.name.field_2;
    local_48.name._M_string_length = 0;
    local_48.name.field_2._M_local_buf[0] = '\0';
    local_48.address = memoryAddress;
    std::__cxx11::string::_M_assign((string *)&local_48);
    pSVar1 = (this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar2 = *(pointer *)
              ((long)&pSVar1[this->currentModule].symbols.
                      super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl + 8)
    ;
    for (__lhs = *(pointer *)
                  &pSVar1[this->currentModule].symbols.
                   super__Vector_base<SymDataSymbol,_std::allocator<SymDataSymbol>_>._M_impl;
        __lhs != pSVar2; __lhs = __lhs + 1) {
      if (__lhs->address == local_48.address) {
        _Var3 = std::operator==(&__lhs->name,&local_48.name);
        if (_Var3) goto LAB_0013aa0a;
      }
    }
    std::vector<SymDataSymbol,_std::allocator<SymDataSymbol>_>::push_back
              (&(this->modules).super__Vector_base<SymDataModule,_std::allocator<SymDataModule>_>.
                _M_impl.super__Vector_impl_data._M_start[this->currentModule].symbols,&local_48);
LAB_0013aa0a:
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

void SymbolData::addLabel(int64_t memoryAddress, const std::string& name)
{
	if (!enabled)
		return;
	
	SymDataSymbol sym;
	sym.address = memoryAddress;
	sym.name = name;

	for (SymDataSymbol& symbol: modules[currentModule].symbols)
	{
		if (symbol.address == sym.address && symbol.name == sym.name)
			return;
	}

	modules[currentModule].symbols.push_back(sym);
}